

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgvalfmt.c
# Opt level: O2

int mpt_msgvalfmt_typeid(uint8_t fmt)

{
  byte bVar1;
  uint uVar2;
  size_t len;
  
  if (-1 < (char)fmt) {
    return -2;
  }
  len = mpt_msgvalfmt_size(fmt);
  uVar2 = 0xfffffffd;
  switch(fmt >> 5 & 3) {
  case 0:
    goto switchD_00114456_caseD_0;
  case 1:
    bVar1 = mpt_type_uint(len);
    break;
  case 2:
    if (len == 4) {
      return 0x66;
    }
    if (len != 0x10) {
      if (len != 8) {
        return -3;
      }
      return 100;
    }
    return 0x65;
  case 3:
    bVar1 = mpt_type_int(len);
  }
  uVar2 = 0xfffffffd;
  if (bVar1 != 0) {
    uVar2 = (uint)bVar1;
  }
switchD_00114456_caseD_0:
  return uVar2;
}

Assistant:

extern int mpt_msgvalfmt_typeid(uint8_t fmt)
{
	ssize_t size;
	/* value in wrong byte order */
	if ((fmt & MPT_MESGVAL(ByteOrderLittle)) != MPT_MESGVAL(ByteOrderNative)) {
		return MPT_ERROR(BadValue);
	}
	size = mpt_msgvalfmt_size(fmt);
	
	switch (fmt & MPT_MESGVAL(Normal)) {
	  /* no representation for big numbers */
	  case 0:
		return MPT_ERROR(BadType);
	  case MPT_MESGVAL(Integer):
		fmt = mpt_type_int(size);
		break;
	  case MPT_MESGVAL(Float):
		switch (size) {
		  case sizeof(float): return 'f';
		  case sizeof(double): return 'd';
		  case sizeof(long double): return 'e';
		  default: return MPT_ERROR(BadType);
		}
	  case MPT_MESGVAL(Unsigned):
		fmt = mpt_type_uint(size);
		break;
	}
	return fmt ? fmt : MPT_ERROR(BadType);
}